

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O3

int pool_bulk_insert(StringPool *pool,xmlHashTablePtr hash,size_t num)

{
  ulong uVar1;
  xmlChar xVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  long *plVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  xmlChar tmp_key [1];
  xmlChar *str [3];
  undefined1 local_7d;
  int local_7c;
  ulong local_78;
  xmlHashTablePtr local_70;
  long local_68 [3];
  StringPool *local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = pool->index;
  local_48 = num;
  if (num == 0 || pool->num_strings <= local_38) {
    local_78 = 0;
LAB_00103ab3:
    pool->index = local_38;
    return (int)local_78;
  }
  local_78 = 0;
  local_40 = 0;
  local_50 = pool;
  local_70 = hash;
LAB_00103747:
  local_7c = 0;
LAB_00103759:
  if (pool->num_keys == 0) {
LAB_0010395a:
    if (local_7c == 0) goto LAB_00103a63;
  }
  else {
    uVar14 = 0;
    uVar11 = rng_state_1;
    uVar12 = rng_state_0;
    do {
      xVar2 = pool->id;
      uVar11 = uVar11 ^ uVar12;
      uVar13 = uVar11 << 9 ^ (uVar12 << 0x1a | uVar12 >> 6) ^ uVar11;
      uVar15 = (uVar12 * -0x61c88645 >> 0x1b | uVar12 << 5) * 5 & 0x3f;
      uVar1 = (ulong)uVar15 + 1;
      uVar11 = (uVar11 << 0xd | uVar11 >> 0x13) ^ uVar13;
      rng_state_0 = uVar11 << 9 ^ (uVar13 << 0x1a | uVar13 >> 6) ^ uVar11;
      rng_state_1 = uVar11 << 0xd | uVar11 >> 0x13;
      lVar7 = (*_xmlMalloc)(uVar15 + 2);
      pool = local_50;
      uVar8 = 0;
      uVar11 = rng_state_1;
      uVar12 = rng_state_0;
      do {
        uVar3 = (uVar12 * -0x61c88645 >> 0x1b | uVar12 * -0x3910c8a0) * 5;
        uVar11 = uVar11 ^ uVar12;
        uVar12 = (uVar12 << 0x1a | uVar12 >> 6) ^ uVar11 << 9 ^ uVar11;
        uVar11 = uVar11 << 0xd | uVar11 >> 0x13;
        *(char *)(lVar7 + uVar8) =
             ((char)uVar3 - ((char)(uVar3 / 0x1a) * '\x19' + (char)(uVar3 / 0x1a))) + 'a';
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
      uVar8 = (ulong)((uVar13 * -0x61c88645 >> 0x1b | uVar13 * -0x3910c8a0) * 5) % uVar1;
      rng_state_0 = uVar12;
      rng_state_1 = uVar11;
      *(xmlChar *)(lVar7 + uVar8) = xVar2;
      *(undefined1 *)(lVar7 + uVar1) = 0;
      if (2 < uVar15) {
        uVar13 = uVar12 * 0x1e3779bb;
        uVar11 = uVar11 ^ uVar12;
        rng_state_0 = (uVar12 << 0x1a | uVar12 >> 6) ^ uVar11 << 9 ^ uVar11;
        uVar11 = uVar11 << 0xd | uVar11 >> 0x13;
        rng_state_1 = uVar11;
        uVar12 = rng_state_0;
        if ((uVar13 & 0x18000000) != 0) {
          uVar11 = uVar11 ^ rng_state_0;
          uVar12 = uVar11 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar11;
          uVar11 = uVar11 << 0xd | uVar11 >> 0x13;
          uVar13 = ((rng_state_0 * -0x61c88645 >> 0x1b | rng_state_0 * -0x3910c8a0) * 5) %
                   (uVar15 - 2);
          uVar15 = uVar13 + 1;
          uVar13 = uVar13 + 2;
          if (uVar15 < (uint)uVar8) {
            uVar13 = uVar15;
          }
          rng_state_0 = uVar12;
          rng_state_1 = uVar11;
          *(undefined1 *)(lVar7 + (ulong)uVar13) = 0x3a;
        }
      }
      local_68[uVar14] = lVar7;
      lVar5 = local_68[2];
      lVar4 = local_68[1];
      lVar7 = local_68[0];
      uVar14 = uVar14 + 1;
      uVar1 = pool->num_keys;
    } while (uVar14 < uVar1);
    if (uVar1 == 3) {
      local_7c = xmlHashAddEntry3(local_70,local_68[0],local_68[1],local_68[2],&local_7d);
      if (local_7c == 0) {
        iVar6 = xmlHashUpdateEntry3(local_70,lVar7,lVar4,lVar5,lVar7,0);
LAB_00103a47:
        local_78 = (ulong)((uint)local_78 | -(uint)(iVar6 != 0));
        goto LAB_00103a63;
      }
    }
    else if (uVar1 == 2) {
      local_7c = xmlHashAddEntry2(local_70,local_68[0],local_68[1],&local_7d);
      if (local_7c == 0) {
        iVar6 = xmlHashUpdateEntry2(local_70,lVar7,lVar4,lVar7,0);
        goto LAB_00103a47;
      }
    }
    else {
      if (uVar1 != 1) goto LAB_0010395a;
      local_7c = xmlHashAddEntry(local_70,local_68[0],&local_7d);
      if (local_7c == 0) goto LAB_001039ed;
    }
  }
  if (pool->num_keys != 0) {
    uVar14 = 0;
    do {
      (*_xmlFree)(local_68[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar14 < pool->num_keys);
  }
  goto LAB_00103759;
LAB_001039ed:
  iVar6 = xmlHashUpdateEntry(local_70,lVar7,lVar7,0);
  local_78 = (ulong)((uint)local_78 | -(uint)(iVar6 != 0));
LAB_00103a63:
  sVar9 = pool->num_keys;
  if (sVar9 != 0) {
    plVar10 = local_68;
    do {
      pool->strings[local_38] = (xmlChar *)*plVar10;
      local_38 = local_38 + 1;
      plVar10 = plVar10 + 1;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  if ((pool->num_strings <= local_38) || (local_40 = local_40 + 1, local_48 <= local_40))
  goto LAB_00103ab3;
  goto LAB_00103747;
}

Assistant:

static int
pool_bulk_insert(StringPool *pool, xmlHashTablePtr hash, size_t num) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar *str[3];
        size_t k;

        while (1) {
            xmlChar tmp_key[1];
            int res;

            for (k = 0; k < pool->num_keys; k++)
                str[k] = gen_random_string(pool->id);

            switch (pool->num_keys) {
                case 1:
                    res = xmlHashAddEntry(hash, str[0], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry(hash, str[0], str[0], NULL) != 0)
                        ret = -1;
                    break;
                case 2:
                    res = xmlHashAddEntry2(hash, str[0], str[1], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry2(hash, str[0], str[1], str[0],
                                            NULL) != 0)
                        ret = -1;
                    break;
                case 3:
                    res = xmlHashAddEntry3(hash, str[0], str[1], str[2],
                                           tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry3(hash, str[0], str[1], str[2],
                                            str[0], NULL) != 0)
                        ret = -1;
                    break;
            }

            if (res == 0)
                break;
            for (k = 0; k < pool->num_keys; k++)
                xmlFree(str[k]);
        }

        for (k = 0; k < pool->num_keys; k++)
            pool->strings[i++] = str[k];
    }

    pool->index = i;
    return ret;
}